

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::AppendPolygon(Clipper *this,TEdge *e1,TEdge *e2)

{
  int iVar1;
  int iVar2;
  OutRec *outRec1_00;
  OutRec *outRec2_00;
  OutPt *pOVar3;
  OutPt *pOVar4;
  OutPt *pp;
  OutPt *pOVar5;
  bool bVar6;
  reference ppOVar7;
  long local_68;
  TEdge *e;
  int ObsoleteIdx;
  int OKIdx;
  OutPt *p2_rt;
  OutPt *p2_lft;
  OutPt *p1_rt;
  OutPt *p1_lft;
  OutRec *holeStateRec;
  OutRec *outRec2;
  OutRec *outRec1;
  TEdge *e2_local;
  TEdge *e1_local;
  Clipper *this_local;
  
  ppOVar7 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                      ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                       ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]),(long)e1->OutIdx);
  outRec1_00 = *ppOVar7;
  ppOVar7 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                      ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                       ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]),(long)e2->OutIdx);
  outRec2_00 = *ppOVar7;
  bVar6 = OutRec1RightOfOutRec2(outRec1_00,outRec2_00);
  p1_lft = (OutPt *)outRec2_00;
  if ((!bVar6) &&
     (bVar6 = OutRec1RightOfOutRec2(outRec2_00,outRec1_00), p1_lft = (OutPt *)outRec1_00, !bVar6)) {
    p1_lft = (OutPt *)GetLowermostRec(outRec1_00,outRec2_00);
  }
  pOVar3 = outRec1_00->Pts;
  pOVar4 = pOVar3->Prev;
  pp = outRec2_00->Pts;
  pOVar5 = pp->Prev;
  if (e1->Side == esLeft) {
    if (e2->Side == esLeft) {
      ReversePolyPtLinks(pp);
      pp->Next = pOVar3;
      pOVar3->Prev = pp;
      pOVar4->Next = pOVar5;
      pOVar5->Prev = pOVar4;
      outRec1_00->Pts = pOVar5;
    }
    else {
      pOVar5->Next = pOVar3;
      pOVar3->Prev = pOVar5;
      pp->Prev = pOVar4;
      pOVar4->Next = pp;
      outRec1_00->Pts = pp;
    }
  }
  else if (e2->Side == esRight) {
    ReversePolyPtLinks(pp);
    pOVar4->Next = pOVar5;
    pOVar5->Prev = pOVar4;
    pp->Next = pOVar3;
    pOVar3->Prev = pp;
  }
  else {
    pOVar4->Next = pp;
    pp->Prev = pOVar4;
    pOVar3->Prev = pOVar5;
    pOVar5->Next = pOVar3;
  }
  outRec1_00->BottomPt = (OutPt *)0x0;
  if ((OutRec *)p1_lft == outRec2_00) {
    if (outRec2_00->FirstLeft != outRec1_00) {
      outRec1_00->FirstLeft = outRec2_00->FirstLeft;
    }
    outRec1_00->IsHole = (bool)(outRec2_00->IsHole & 1);
  }
  outRec2_00->Pts = (OutPt *)0x0;
  outRec2_00->BottomPt = (OutPt *)0x0;
  outRec2_00->FirstLeft = outRec1_00;
  iVar1 = e1->OutIdx;
  iVar2 = e2->OutIdx;
  e1->OutIdx = -1;
  e2->OutIdx = -1;
  local_68 = *(long *)(this->_vptr_Clipper[-3] + 0x10 +
                      (long)&(this->m_Maxima).
                             super__List_base<long_long,_std::allocator<long_long>_>);
  do {
    if (local_68 == 0) {
LAB_00591c81:
      outRec2_00->Idx = outRec1_00->Idx;
      return;
    }
    if (*(int *)(local_68 + 0x4c) == iVar2) {
      *(int *)(local_68 + 0x4c) = iVar1;
      *(EdgeSide *)(local_68 + 0x3c) = e1->Side;
      goto LAB_00591c81;
    }
    local_68 = *(long *)(local_68 + 0x68);
  } while( true );
}

Assistant:

void Clipper::AppendPolygon(TEdge *e1, TEdge *e2)
{
  //get the start and ends of both output polygons ...
  OutRec *outRec1 = m_PolyOuts[e1->OutIdx];
  OutRec *outRec2 = m_PolyOuts[e2->OutIdx];

  OutRec *holeStateRec;
  if (OutRec1RightOfOutRec2(outRec1, outRec2))
    holeStateRec = outRec2;
  else if (OutRec1RightOfOutRec2(outRec2, outRec1))
    holeStateRec = outRec1;
  else 
    holeStateRec = GetLowermostRec(outRec1, outRec2);

  //get the start and ends of both output polygons and
  //join e2 poly onto e1 poly and delete pointers to e2 ...

  OutPt* p1_lft = outRec1->Pts;
  OutPt* p1_rt = p1_lft->Prev;
  OutPt* p2_lft = outRec2->Pts;
  OutPt* p2_rt = p2_lft->Prev;

  //join e2 poly onto e1 poly and delete pointers to e2 ...
  if(  e1->Side == esLeft )
  {
    if(  e2->Side == esLeft )
    {
      //z y x a b c
      ReversePolyPtLinks(p2_lft);
      p2_lft->Next = p1_lft;
      p1_lft->Prev = p2_lft;
      p1_rt->Next = p2_rt;
      p2_rt->Prev = p1_rt;
      outRec1->Pts = p2_rt;
    } else
    {
      //x y z a b c
      p2_rt->Next = p1_lft;
      p1_lft->Prev = p2_rt;
      p2_lft->Prev = p1_rt;
      p1_rt->Next = p2_lft;
      outRec1->Pts = p2_lft;
    }
  } else
  {
    if(  e2->Side == esRight )
    {
      //a b c z y x
      ReversePolyPtLinks(p2_lft);
      p1_rt->Next = p2_rt;
      p2_rt->Prev = p1_rt;
      p2_lft->Next = p1_lft;
      p1_lft->Prev = p2_lft;
    } else
    {
      //a b c x y z
      p1_rt->Next = p2_lft;
      p2_lft->Prev = p1_rt;
      p1_lft->Prev = p2_rt;
      p2_rt->Next = p1_lft;
    }
  }

  outRec1->BottomPt = 0;
  if (holeStateRec == outRec2)
  {
    if (outRec2->FirstLeft != outRec1)
      outRec1->FirstLeft = outRec2->FirstLeft;
    outRec1->IsHole = outRec2->IsHole;
  }
  outRec2->Pts = 0;
  outRec2->BottomPt = 0;
  outRec2->FirstLeft = outRec1;

  int OKIdx = e1->OutIdx;
  int ObsoleteIdx = e2->OutIdx;

  e1->OutIdx = Unassigned; //nb: safe because we only get here via AddLocalMaxPoly
  e2->OutIdx = Unassigned;

  TEdge* e = m_ActiveEdges;
  while( e )
  {
    if( e->OutIdx == ObsoleteIdx )
    {
      e->OutIdx = OKIdx;
      e->Side = e1->Side;
      break;
    }
    e = e->NextInAEL;
  }

  outRec2->Idx = outRec1->Idx;
}